

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void allocate_src_var_of_4x4_sub_block_buf(AV1_COMP *cpi)

{
  _Bool _Var1;
  AV1_COMP *in_RDI;
  int mi_count_in_sb;
  BLOCK_SIZE sb_size;
  AV1_COMMON *cm;
  Block4x4VarInfo *source_variance_info;
  Block4x4VarInfo *local_10;
  
  _Var1 = is_src_var_for_4x4_sub_blocks_caching_enabled(in_RDI);
  if (_Var1) {
    local_10 = (in_RDI->td).src_var_info_of_4x4_sub_blocks;
    if (local_10 == (Block4x4VarInfo *)0x0) {
      local_10 = (Block4x4VarInfo *)aom_malloc(0x12a19e5);
      if (local_10 == (Block4x4VarInfo *)0x0) {
        aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate source_variance_info");
      }
      (in_RDI->td).src_var_info_of_4x4_sub_blocks = local_10;
    }
    (in_RDI->td).mb.src_var_info_of_4x4_sub_blocks = local_10;
  }
  return;
}

Assistant:

static inline void allocate_src_var_of_4x4_sub_block_buf(AV1_COMP *cpi) {
  if (!is_src_var_for_4x4_sub_blocks_caching_enabled(cpi)) return;

  Block4x4VarInfo *source_variance_info =
      cpi->td.src_var_info_of_4x4_sub_blocks;
  if (!source_variance_info) {
    const AV1_COMMON *const cm = &cpi->common;
    const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
    const int mi_count_in_sb = mi_size_wide[sb_size] * mi_size_high[sb_size];
    CHECK_MEM_ERROR(cm, source_variance_info,
                    aom_malloc(sizeof(*source_variance_info) * mi_count_in_sb));
    cpi->td.src_var_info_of_4x4_sub_blocks = source_variance_info;
  }

  cpi->td.mb.src_var_info_of_4x4_sub_blocks = source_variance_info;
}